

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool __thiscall kj::StringPtr::endsWith(StringPtr *this,StringPtr *other)

{
  bool bVar1;
  ArrayPtr<const_char> local_20;
  ArrayPtr<const_char> local_10;
  
  local_10.ptr = (this->content).ptr;
  local_10.size_ = (this->content).size_ - 1;
  local_20.ptr = (other->content).ptr;
  local_20.size_ = (other->content).size_ - 1;
  bVar1 = ArrayPtr<const_char>::endsWith(&local_10,&local_20);
  return bVar1;
}

Assistant:

inline constexpr bool endsWith(const StringPtr& other) const { return asArray().endsWith(other); }